

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::FileOutputStream::write(FileOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined4 in_register_00000034;
  long lVar2;
  long lVar3;
  ArrayPtr<const_unsigned_char> *__begin1;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  for (lVar3 = __n << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    lVar1 = *(long *)((long)__buf + 8);
    (**(code **)(**(long **)(lVar2 + 8) + 0x48))
              (*(long **)(lVar2 + 8),*(undefined8 *)(lVar2 + 0x10),*__buf,lVar1);
    *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) + lVar1;
    __buf = (void *)((long)__buf + 0x10);
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (ssize_t)this;
}

Assistant:

Promise<void> FileOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
  // TODO(perf): Extend kj::File with an array-of-arrays write?
  for (auto piece: pieces) {
    file.write(offset, piece);
    offset += piece.size();
  }
  return kj::READY_NOW;
}